

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.c
# Opt level: O1

void Node_compile_c_ko(Node *node,int ko)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  Node *pNVar6;
  long lVar7;
  uint uVar8;
  char *__format;
  char *pcVar9;
  code *pcVar10;
  uint uVar11;
  undefined1 *__s;
  uchar *local_70;
  FILE *local_68;
  Node *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar8 = yyl_prev;
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/compile.c"
                  ,0xb1,"void Node_compile_c_ko(Node *, int)");
  }
  pNVar6 = (Node *)(ulong)(uint)node->type;
  switch(node->type) {
  case 1:
    Node_compile_c_ko_cold_1();
    pNVar6 = node;
  default:
    Node_compile_c_ko_cold_2();
    pbVar1 = (byte *)((long)pNVar6 + (long)(ko >> 3));
    *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ko & 7));
    return;
  case 3:
    fprintf((FILE *)output,"  if (!yy_%s(G)) ",*(undefined8 *)((node->rule).name + 0x18));
    if ((node->rule).errblock == (char *)0x0) {
      pcVar9 = " goto l%d;\n";
    }
    else {
      fwrite("{ ",2,1,(FILE *)output);
      fprintf((FILE *)output,
              " { YY_XTYPE YY_XVAR = (YY_XTYPE) G->data; int yyindex = G->offset + G->pos; %s; }",
              (node->rule).errblock);
      pcVar9 = " goto l%d; }\n";
    }
    fprintf((FILE *)output,pcVar9,(ulong)(uint)ko);
    if ((node->rule).variables == (Node *)0x0) {
      return;
    }
    uVar4 = (ulong)(uint)(((node->rule).variables)->variable).offset;
    pcVar9 = "  yyDo(G, yySet, %d, 0, \"yySet\");\n";
    break;
  case 4:
    pcVar9 = "  if (!yymatchDot(G)) goto l%d;";
LAB_00105641:
    uVar4 = (ulong)(uint)ko;
    break;
  case 5:
  case 6:
    pcVar9 = (node->rule).name;
    sVar3 = strlen(pcVar9);
    if ((int)sVar3 == 2) {
      if (*pcVar9 == '\\') {
LAB_00105973:
        __format = "  if (!yymatchChar(G, \'%s\')) goto l%d;\n";
        goto LAB_00105990;
      }
    }
    else if ((int)sVar3 == 1) {
      if (*pcVar9 != '\'') goto LAB_00105973;
      pcVar9 = "  if (!yymatchChar(G, \'\\\'\')) goto l%d;\n";
      goto LAB_00105641;
    }
    __format = "  if (!yymatchString(G, \"%s\")) goto l%d;\n";
LAB_00105990:
    fprintf((FILE *)output,__format,pcVar9,(ulong)(uint)ko);
    return;
  case 7:
    local_68 = (FILE *)output;
    local_70 = (uchar *)(node->rule).name;
    if (*local_70 == '^') {
      local_48._8_4_ = 0xffffffff;
      local_48._0_8_ = 0xffffffffffffffff;
      local_48._12_4_ = 0xffffffff;
      local_58._8_4_ = 0xffffffff;
      local_58._0_8_ = 0xffffffffffffffff;
      local_58._12_4_ = 0xffffffff;
      local_70 = local_70 + 1;
      pcVar10 = charClassClear;
    }
    else {
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      pcVar10 = charClassSet;
    }
    uVar8 = 0xffffffff;
    local_60 = node;
    do {
      while (uVar5 = uVar8, uVar8 = readChar(&local_70), (char)uVar8 != '-') {
        if ((uVar8 & 0xff) == 0) {
          __s = makeCharClass_string;
          lVar7 = 0;
          do {
            iVar2 = sprintf(__s,"\\%03o",(ulong)(byte)local_58[lVar7]);
            __s = __s + iVar2;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x20);
          pcVar9 = yyqq((local_60->rule).name);
          fprintf(local_68,
                  "  if (!yymatchClass(G, (const unsigned char *)\"%s\", \"%s\")) goto l%d;\n",
                  makeCharClass_string,pcVar9,(ulong)(uint)ko);
          return;
        }
LAB_001059eb:
        (*pcVar10)(local_58,uVar8);
      }
      if (((int)uVar5 < 0) || (*local_70 == '\0')) goto LAB_001059eb;
      iVar2 = readChar(&local_70);
      uVar8 = 0xffffffff;
      if ((int)uVar5 <= iVar2) {
        do {
          (*pcVar10)(local_58,uVar5);
          uVar5 = uVar5 + 1;
        } while (iVar2 + 1U != uVar5);
        uVar8 = 0xffffffff;
      }
    } while( true );
  case 8:
    fprintf((FILE *)output,"  yyDo(G, yy%s, G->begin, G->end, \"yy%s\");\n",(node->rule).expression)
    ;
    return;
  case 9:
    pcVar9 = (node->rule).name;
    __format = "  yyText(G, G->begin, G->end);  if (!(%s)) goto l%d;";
    goto LAB_00105990;
  case 10:
    uVar8 = yyl_prev + 1;
    yyl_prev = uVar8;
    fwrite("\n  {",4,1,(FILE *)output);
    fprintf((FILE *)output,"  int yypos%d= G->pos, yythunkpos%d= G->thunkpos;",(ulong)uVar8,
            (ulong)uVar8);
    for (pNVar6 = (node->name).rule; pNVar6 != (Node *)0x0; pNVar6 = (pNVar6->rule).next) {
      if ((pNVar6->rule).next == (Node *)0x0) {
        Node_compile_c_ko(pNVar6,ko);
      }
      else {
        uVar5 = yyl_prev + 1;
        yyl_prev = uVar5;
        Node_compile_c_ko(pNVar6,uVar5);
        fprintf((FILE *)output,"  goto l%d;",(ulong)uVar8);
        fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar5);
        fprintf((FILE *)output,"  G->pos= yypos%d; G->thunkpos= yythunkpos%d;",(ulong)uVar8,
                (ulong)uVar8);
      }
    }
    fwrite("\n  }",4,1,(FILE *)output);
    pcVar9 = "\n  l%d:;\t";
    uVar4 = (ulong)uVar8;
    break;
  case 0xb:
    for (pNVar6 = (node->name).rule; pNVar6 != (Node *)0x0; pNVar6 = (pNVar6->rule).next) {
      Node_compile_c_ko(pNVar6,ko);
    }
    return;
  case 0xc:
    uVar5 = yyl_prev + 1;
    yyl_prev = uVar5;
    fwrite("\n  {",4,1,(FILE *)output);
    fprintf((FILE *)output,"  int yypos%d= G->pos, yythunkpos%d= G->thunkpos;",(ulong)uVar5,
            (ulong)uVar5);
    Node_compile_c_ko((node->name).rule,ko);
    goto LAB_00105698;
  case 0xd:
    uVar5 = yyl_prev + 1;
    yyl_prev = uVar5;
    fwrite("\n  {",4,1,(FILE *)output);
    fprintf((FILE *)output,"  int yypos%d= G->pos, yythunkpos%d= G->thunkpos;",(ulong)uVar5,
            (ulong)uVar5);
    Node_compile_c_ko((node->name).rule,uVar5);
    fprintf((FILE *)output,"  goto l%d;",(ulong)(uint)ko);
    fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar5);
LAB_00105698:
    uVar8 = uVar8 + 1;
    fprintf((FILE *)output,"  G->pos= yypos%d; G->thunkpos= yythunkpos%d;",(ulong)uVar8,(ulong)uVar8
           );
LAB_0010593f:
    fwrite("\n  }",4,1,(FILE *)output);
    return;
  case 0xe:
    uVar8 = yyl_prev + 1;
    uVar5 = yyl_prev + 2;
    yyl_prev = uVar5;
    fwrite("\n  {",4,1,(FILE *)output);
    fprintf((FILE *)output,"  int yypos%d= G->pos, yythunkpos%d= G->thunkpos;",(ulong)uVar8,
            (ulong)uVar8);
    Node_compile_c_ko((node->name).rule,uVar8);
    fprintf((FILE *)output,"  goto l%d;",(ulong)uVar5);
    fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar8);
    fprintf((FILE *)output,"  G->pos= yypos%d; G->thunkpos= yythunkpos%d;",(ulong)uVar8,(ulong)uVar8
           );
    fwrite("\n  }",4,1,(FILE *)output);
    pcVar9 = "\n  l%d:;\t";
    uVar4 = (ulong)uVar5;
    break;
  case 0xf:
    uVar5 = yyl_prev + 1;
    uVar11 = yyl_prev + 2;
    yyl_prev = uVar11;
    fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar5);
    fwrite("\n  {",4,1,(FILE *)output);
    fprintf((FILE *)output,"  int yypos%d= G->pos, yythunkpos%d= G->thunkpos;",(ulong)uVar11,
            (ulong)uVar11);
    Node_compile_c_ko((node->name).rule,uVar11);
    fprintf((FILE *)output,"  goto l%d;",(ulong)uVar5);
    fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar11);
    goto LAB_00105935;
  case 0x10:
    uVar5 = yyl_prev + 1;
    uVar11 = yyl_prev + 2;
    yyl_prev = uVar11;
    Node_compile_c_ko((node->name).rule,ko);
    fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar5);
    fwrite("\n  {",4,1,(FILE *)output);
    fprintf((FILE *)output,"  int yypos%d= G->pos, yythunkpos%d= G->thunkpos;",(ulong)uVar11,
            (ulong)uVar11);
    Node_compile_c_ko((node->name).rule,uVar11);
    fprintf((FILE *)output,"  goto l%d;",(ulong)uVar5);
    fprintf((FILE *)output,"\n  l%d:;\t",(ulong)uVar11);
LAB_00105935:
    uVar8 = uVar8 + 2;
    fprintf((FILE *)output,"  G->pos= yypos%d; G->thunkpos= yythunkpos%d;",(ulong)uVar8,(ulong)uVar8
           );
    goto LAB_0010593f;
  }
  fprintf((FILE *)output,pcVar9,uVar4);
  return;
}

Assistant:

static void Node_compile_c_ko(Node *node, int ko)
{
  assert(node);
  switch (node->type)
    {
    case Rule:
      fprintf(stderr, "\ninternal error #1 (%s)\n", node->rule.name);
      exit(1);
      break;

    case Dot:
      fprintf(output, "  if (!yymatchDot(G)) goto l%d;", ko);
      break;

    case Name:
      fprintf(output, "  if (!yy_%s(G)) ", node->name.rule->rule.name);
      if(((struct Any*) node)->errblock) {
	fprintf(output, "{ ");
	callErrBlock(node);
	fprintf(output, " goto l%d; }\n", ko);
      } else {
	fprintf(output, " goto l%d;\n", ko);
      }
      if (node->name.variable)
	fprintf(output, "  yyDo(G, yySet, %d, 0, \"yySet\");\n", node->name.variable->variable.offset);
      break;

    case Character:
    case String:
      {
	int len= strlen(node->string.value);
	if (1 == len)
	  {
	    if ('\'' == node->string.value[0])
	      fprintf(output, "  if (!yymatchChar(G, '\\'')) goto l%d;\n", ko);
	    else
	      fprintf(output, "  if (!yymatchChar(G, '%s')) goto l%d;\n", node->string.value, ko);
	  }
	else
	  if (2 == len && '\\' == node->string.value[0])
	    fprintf(output, "  if (!yymatchChar(G, '%s')) goto l%d;\n", node->string.value, ko);
	  else
	    fprintf(output, "  if (!yymatchString(G, \"%s\")) goto l%d;\n", node->string.value, ko);
      }
      break;

    case Class:
      fprintf(output, "  if (!yymatchClass(G, (const unsigned char *)\"%s\", \"%s\")) goto l%d;\n", makeCharClass(node->cclass.value), yyqq((char*)node->cclass.value), ko);
      break;

    case Action:
      fprintf(output, "  yyDo(G, yy%s, G->begin, G->end, \"yy%s\");\n", node->action.name, node->action.name);
      break;

    case Predicate:
      fprintf(output, "  yyText(G, G->begin, G->end);  if (!(%s)) goto l%d;", node->action.text, ko);
      break;

    case Alternate:
      {
        int ok= yyl();
        begin();
        save(ok);
        for (node= node->alternate.first;  node;  node= node->alternate.next)
          if (node->alternate.next)
            {
              int next= yyl();
              Node_compile_c_ko(node, next);
              jump(ok);
              label(next);
              restore(ok);
            }
          else
            Node_compile_c_ko(node, ko);
        end();
        label(ok);
      }
      break;

    case Sequence:
      for (node= node->sequence.first;  node;  node= node->sequence.next)
        Node_compile_c_ko(node, ko);
      break;

    case PeekFor:
      {
        int ok= yyl();
        begin();
        save(ok);
        Node_compile_c_ko(node->peekFor.element, ko);
        restore(ok);
        end();
      }
      break;

    case PeekNot:
      {
        int ok= yyl();
        begin();
        save(ok);
        Node_compile_c_ko(node->peekFor.element, ok);
        jump(ko);
        label(ok);
        restore(ok);
        end();
      }
      break;

    case Query:
      {
        int qko= yyl(), qok= yyl();
        begin();
        save(qko);
        Node_compile_c_ko(node->query.element, qko);
        jump(qok);
        label(qko);
        restore(qko);
        end();
        label(qok);
      }
      break;

    case Star:
      {
        int again= yyl(), out= yyl();
        label(again);
        begin();
        save(out);
        Node_compile_c_ko(node->star.element, out);
        jump(again);
        label(out);
        restore(out);
        end();
      }
      break;

    case Plus:
      {
        int again= yyl(), out= yyl();
        Node_compile_c_ko(node->plus.element, ko);
        label(again);
        begin();
        save(out);
        Node_compile_c_ko(node->plus.element, out);
        jump(again);
        label(out);
        restore(out);
        end();
      }
      break;

    default:
      fprintf(stderr, "\nNode_compile_c_ko: illegal node type %d\n", node->type);
      exit(1);
    }
}